

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Table_EraseMaintainsValidIterator_Test::
~Table_EraseMaintainsValidIterator_Test(Table_EraseMaintainsValidIterator_Test *this)

{
  Table_EraseMaintainsValidIterator_Test *this_local;
  
  ~Table_EraseMaintainsValidIterator_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Table, EraseMaintainsValidIterator) {
  IntTable t;
  const int kNumElements = 100;
  for (int i = 0; i < kNumElements; i ++) {
    EXPECT_TRUE(t.emplace(i).second);
  }
  EXPECT_EQ(t.size(), kNumElements);

   int num_erase_calls = 0;
  auto it = t.begin();
  while (it != t.end()) {
    t.erase(it++);
    num_erase_calls++;
  }

   EXPECT_TRUE(t.empty());
  EXPECT_EQ(num_erase_calls, kNumElements);
}